

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O2

tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> * __thiscall
polyscope::TransformationGizmo::circleTest
          (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *__return_storage_ptr__,
          TransformationGizmo *this,vec3 raySource,vec3 rayDir,vec3 center,vec3 normal,float radius)

{
  undefined8 uVar1;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  _Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar12 [64];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined8 in_XMM4_Qb;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar17;
  undefined8 in_XMM6_Qb;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_48;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_44;
  float fStack_40;
  float fStack_3c;
  vec<3,_float,_(glm::qualifier)0> local_38;
  vec<3,_float,_(glm::qualifier)0> local_28;
  vec<3,_float,_(glm::qualifier)0> local_18;
  undefined1 extraout_var [60];
  
  local_18.field_2 = normal.field_2;
  aVar17 = center.field_2;
  local_38.field_2 = rayDir.field_2;
  auVar15._8_56_ = rayDir._8_56_;
  auVar15._0_8_ = rayDir._0_8_;
  local_48 = center.field_0;
  aStack_44 = center.field_1;
  fStack_40 = (float)in_XMM4_Qb;
  fStack_3c = (float)((ulong)in_XMM4_Qb >> 0x20);
  uStack_60 = in_XMM0_Qb;
  local_68 = (undefined1  [8])raySource._0_8_;
  local_38._0_8_ = vmovlps_avx(auVar15._0_16_);
  auVar8._8_8_ = in_XMM6_Qb;
  auVar8._0_8_ = normal._0_8_;
  local_18._0_8_ = vmovlps_avx(auVar8);
  auVar12._0_4_ =
       glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                 (&local_18,&local_38);
  auVar12._4_60_ = extraout_var;
  auVar7._8_4_ = 0x7fffffff;
  auVar7._0_8_ = 0x7fffffff7fffffff;
  auVar7._12_4_ = 0x7fffffff;
  auVar7 = vandps_avx512vl(auVar12._0_16_,auVar7);
  if (1e-06 <= auVar7._0_4_) {
    auVar4._8_4_ = fStack_40;
    auVar4._0_8_ = center._0_8_;
    auVar4._12_4_ = fStack_3c;
    auVar7 = vsubps_avx(auVar4,_local_68);
    local_28.field_2.z = aVar17.z - raySource.field_2.z;
    local_28._0_8_ = vmovlps_avx(auVar7);
    fVar10 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                       (&local_28,&local_18);
    fVar10 = fVar10 / auVar12._0_4_;
    fVar9 = 0.0;
    if (0.0 <= fVar10) {
      aVar2.z = (fVar10 * local_38.field_2.z + raySource.field_2.z) - aVar17.z;
      local_68._0_4_ = raySource.field_0;
      local_68._4_4_ = raySource.field_1;
      uStack_60._0_4_ = (float)in_XMM0_Qb;
      uStack_60._4_4_ = (float)((ulong)in_XMM0_Qb >> 0x20);
      auVar14._0_4_ = fVar10 * local_38.field_0.x + (float)local_68._0_4_;
      auVar14._4_4_ = fVar10 * local_38.field_1.y + (float)local_68._4_4_;
      auVar14._8_4_ = fVar10 * 0.0 + (float)uStack_60;
      auVar14._12_4_ = fVar10 * 0.0 + uStack_60._4_4_;
      auVar5._8_4_ = fStack_40;
      auVar5._0_8_ = center._0_8_;
      auVar5._12_4_ = fStack_3c;
      auVar7 = vsubps_avx(auVar14,auVar5);
      local_28._0_8_ = vmovlps_avx(auVar7);
      local_28.field_2.z = aVar2.z;
      auVar11._0_4_ =
           glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(&local_28);
      auVar11._4_4_ = auVar11._0_4_;
      auVar11._8_4_ = auVar11._0_4_;
      auVar11._12_4_ = auVar11._0_4_;
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar8 = vandps_avx512vl(ZEXT416((uint)(auVar11._0_4_ - radius)),auVar3);
      fVar13 = auVar8._0_4_;
      auVar7 = vdivps_avx(auVar7,auVar11);
      auVar16._0_4_ = auVar7._0_4_ * radius + local_48.x;
      auVar16._4_4_ = auVar7._4_4_ * radius + aStack_44.y;
      auVar16._8_4_ = auVar7._8_4_ * radius + fStack_40;
      auVar16._12_4_ = auVar7._12_4_ * radius + fStack_3c;
      fVar9 = (aVar2.z / auVar11._0_4_) * radius + aVar17.z;
      uVar1 = vmovlps_avx(auVar16);
      p_Var6 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
                super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
      (p_Var6->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
      (p_Var6->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar1 >> 0x20);
    }
    else {
      fVar10 = -1.0;
      fVar13 = INFINITY;
      p_Var6 = &(__return_storage_ptr__->
                super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
                super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
      (p_Var6->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
           (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
      (p_Var6->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
      super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    }
  }
  else {
    fVar10 = -1.0;
    fVar13 = INFINITY;
    p_Var6 = &(__return_storage_ptr__->
              super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
              super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
    (p_Var6->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
    super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
    (p_Var6->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
    super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
    fVar9 = 0.0;
  }
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2.z = fVar9
  ;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Head_base<1UL,_float,_false>._M_head_impl = fVar13;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<0UL,_float,_false>._M_head_impl = fVar10;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<float, float, glm::vec3> TransformationGizmo::circleTest(glm::vec3 raySource, glm::vec3 rayDir,
                                                                    glm::vec3 center, glm::vec3 normal, float radius) {

  // used for explicit constructors below to make old compilers (gcc-5) happy
  typedef std::tuple<float, float, glm::vec3> ret_t;

  // Intersect the ray with the plane defined by the normal
  float div = glm::dot(normal, rayDir);
  if (std::fabs(div) < 1e-6)
    return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}}; // parallel

  float tRay = glm::dot((center - raySource), normal) / div;
  if (tRay < 0) return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}}; // behind the ray

  glm::vec3 hitPoint = raySource + tRay * rayDir;

  // Find the closest point on the circle
  float hitRad = glm::length(hitPoint - center);
  float ringDist = std::fabs(hitRad - radius);
  glm::vec3 nearestPoint = center + (hitPoint - center) / hitRad * radius;

  return ret_t{tRay, ringDist, nearestPoint};
}